

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
          (Promise<void> *this,String *attachments,
          Array<kj::ArrayPtr<const_unsigned_char>_> *attachments_1)

{
  char *pcVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  PromiseNode *pPVar4;
  long *in_RCX;
  Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_> local_58;
  PromiseNode *local_20;
  
  local_58.impl.super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)attachments_1->ptr;
  local_58.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = attachments_1->size_;
  local_58.impl.super_TupleElement<0U,_kj::String>.value.content.disposer = attachments_1->disposer;
  attachments_1->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
  attachments_1->size_ = 0;
  local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.ptr =
       (ArrayPtr<const_unsigned_char> *)*in_RCX;
  local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.size_ =
       in_RCX[1];
  local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.
  disposer = (ArrayDisposer *)in_RCX[2];
  *in_RCX = 0;
  in_RCX[1] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>,kj::_::PromiseDisposer,kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_58);
  pPVar4 = local_20;
  sVar2 = local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value
          .size_;
  pAVar3 = local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.
           value.ptr;
  local_20 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar4;
  if (local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.ptr
      != (ArrayPtr<const_unsigned_char> *)0x0) {
    local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.ptr =
         (ArrayPtr<const_unsigned_char> *)0x0;
    local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.size_
         = 0;
    (**(local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.
       disposer)->_vptr_ArrayDisposer)
              (local_58.impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.
               value.disposer,pAVar3,0x10,sVar2,sVar2,0);
  }
  sVar2 = local_58.impl.super_TupleElement<0U,_kj::String>.value.content.size_;
  pcVar1 = local_58.impl.super_TupleElement<0U,_kj::String>.value.content.ptr;
  if ((ArrayPtr<const_unsigned_char> *)
      local_58.impl.super_TupleElement<0U,_kj::String>.value.content.ptr !=
      (ArrayPtr<const_unsigned_char> *)0x0) {
    local_58.impl.super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
    local_58.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
    (**(local_58.impl.super_TupleElement<0U,_kj::String>.value.content.disposer)->
       _vptr_ArrayDisposer)
              (local_58.impl.super_TupleElement<0U,_kj::String>.value.content.disposer,pcVar1,1,
               sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}